

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauDsd.c
# Opt level: O1

int Dau_DsdDecomposeSingleVar(Dau_Dsd_t *p,word *pTruth,int *pVars,int nVars)

{
  int iVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  timespec ts;
  long local_48;
  timespec local_40;
  
  iVar2 = clock_gettime(3,&local_40);
  if (iVar2 < 0) {
    local_48 = 1;
  }
  else {
    lVar4 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_40.tv_nsec),8);
    local_48 = ((lVar4 >> 7) - (lVar4 >> 0x3f)) + local_40.tv_sec * -1000000;
  }
  iVar2 = nVars;
  if (nVars < 2) {
    __assert_fail("nVars > 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dau/dauDsd.c"
                  ,0x611,"int Dau_DsdDecomposeSingleVar(Dau_Dsd_t *, word *, int *, int)");
  }
LAB_00502fa7:
  do {
    iVar1 = iVar2;
    if ((0 < iVar1) && (1 < nVars)) {
      iVar3 = Dau_DsdDecomposeSingleVarOne(p,pTruth,pVars,nVars,iVar1 + -1);
      iVar2 = iVar1 + -1;
      if (iVar3 == 0) goto LAB_00502fa7;
      nVars = nVars + -1;
    }
    if ((iVar1 == 0) || (iVar2 = nVars, nVars == 1)) {
      if (nVars == 1) {
        Dau_DsdWriteVar(p,*pVars,(uint)*pTruth & 1);
        nVars = 0;
      }
      iVar2 = clock_gettime(3,&local_40);
      if (iVar2 < 0) {
        lVar4 = -1;
      }
      else {
        lVar4 = local_40.tv_nsec / 1000 + local_40.tv_sec * 1000000;
      }
      s_Times_0 = s_Times_0 + lVar4 + local_48;
      return nVars;
    }
  } while( true );
}

Assistant:

int Dau_DsdDecomposeSingleVar( Dau_Dsd_t * p, word * pTruth, int * pVars, int nVars )
{
    abctime clk = Abc_Clock();
    assert( nVars > 1 );
    while ( 1 )
    {
        int v;
        for ( v = nVars - 1; v >= 0 && nVars > 1; v-- )
            if ( Dau_DsdDecomposeSingleVarOne( p, pTruth, pVars, nVars, v ) )
            {
                nVars--;
                break;
            }
        if ( v == -1 || nVars == 1 )
            break;
    }
    if ( nVars == 1 )
        Dau_DsdWriteVar( p, pVars[--nVars], (int)(pTruth[0] & 1) );
    s_Times[0] += Abc_Clock() - clk;
    return nVars;
}